

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MixSegment.hpp
# Opt level: O0

void __thiscall
cppjieba::MixSegment::Cut
          (MixSegment *this,const_iterator begin,const_iterator end,
          vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *res,bool hmm)

{
  const_iterator pRVar1;
  bool bVar2;
  size_type sVar3;
  reference pvVar4;
  byte local_c9;
  ulong local_88;
  size_t k;
  size_t j;
  size_t i;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> hmmRes;
  undefined1 local_48 [8];
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> words;
  bool hmm_local;
  vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *res_local;
  const_iterator end_local;
  const_iterator begin_local;
  MixSegment *this_local;
  
  words.super__Vector_base<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = hmm;
  if (hmm) {
    std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::vector
              ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)local_48);
    if (end < begin) {
      __assert_fail("end >= begin",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/MixSegment.hpp"
                    ,0x34,
                    "void cppjieba::MixSegment::Cut(RuneStrArray::const_iterator, RuneStrArray::const_iterator, vector<WordRange> &, bool) const"
                   );
    }
    std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::reserve
              ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)local_48,
               ((long)end - (long)begin >> 2) * -0x3333333333333333);
    MPSegment::Cut(&this->mpSeg_,begin,end,
                   (vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)local_48,
                   0x200);
    std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::vector
              ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)&i);
    std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::reserve
              ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)&i,
               ((long)end - (long)begin >> 2) * -0x3333333333333333);
    for (j = 0; sVar3 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::size
                                  ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                                    *)local_48), j < sVar3; j = j + 1) {
      pvVar4 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::operator[]
                         ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
                          local_48,j);
      pRVar1 = pvVar4->left;
      pvVar4 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::operator[]
                         ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
                          local_48,j);
      if (pRVar1 == pvVar4->right) {
        pvVar4 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::operator[]
                           ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
                            local_48,j);
        pRVar1 = pvVar4->left;
        pvVar4 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::operator[]
                           ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
                            local_48,j);
        if (pRVar1 == pvVar4->right) {
          pvVar4 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::
                   operator[]((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
                              local_48,j);
          bVar2 = MPSegment::IsUserDictSingleChineseWord(&this->mpSeg_,&pvVar4->left->rune);
          if (bVar2) goto LAB_0011e4e3;
        }
        k = j;
        while( true ) {
          sVar3 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::size
                            ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
                             local_48);
          local_c9 = 0;
          if (k < sVar3) {
            pvVar4 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::
                     operator[]((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *
                                )local_48,k);
            pRVar1 = pvVar4->left;
            pvVar4 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::
                     operator[]((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *
                                )local_48,k);
            local_c9 = 0;
            if (pRVar1 == pvVar4->right) {
              pvVar4 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::
                       operator[]((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>
                                   *)local_48,k);
              bVar2 = MPSegment::IsUserDictSingleChineseWord(&this->mpSeg_,&pvVar4->left->rune);
              local_c9 = bVar2 ^ 0xff;
            }
          }
          if ((local_c9 & 1) == 0) break;
          k = k + 1;
        }
        if (k - 1 < j) {
          __assert_fail("j - 1 >= i",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/qiangsiwei[P]jiebac/cppjieba/MixSegment.hpp"
                        ,0x48,
                        "void cppjieba::MixSegment::Cut(RuneStrArray::const_iterator, RuneStrArray::const_iterator, vector<WordRange> &, bool) const"
                       );
        }
        pvVar4 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::operator[]
                           ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
                            local_48,j);
        pRVar1 = pvVar4->left;
        pvVar4 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::operator[]
                           ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
                            local_48,k - 1);
        HMMSegment::Cut(&this->hmmSeg_,pRVar1,pvVar4->left + 1,
                        (vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)&i);
        for (local_88 = 0;
            sVar3 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::size
                              ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
                               &i), local_88 < sVar3; local_88 = local_88 + 1) {
          pvVar4 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::
                   operator[]((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
                              &i,local_88);
          std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back
                    (res,pvVar4);
        }
        std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::clear
                  ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)&i);
        j = k - 1;
      }
      else {
LAB_0011e4e3:
        pvVar4 = std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::operator[]
                           ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)
                            local_48,j);
        std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::push_back
                  (res,pvVar4);
      }
    }
    std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::~vector
              ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)&i);
    std::vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_>::~vector
              ((vector<cppjieba::WordRange,_std::allocator<cppjieba::WordRange>_> *)local_48);
  }
  else {
    MPSegment::Cut(&this->mpSeg_,begin,end,res,0x200);
  }
  return;
}

Assistant:

void Cut(RuneStrArray::const_iterator begin, RuneStrArray::const_iterator end, vector<WordRange>& res, bool hmm) const {
    if (!hmm) {
      mpSeg_.Cut(begin, end, res);
      return;
    }
    vector<WordRange> words;
    assert(end >= begin);
    words.reserve(end - begin);
    mpSeg_.Cut(begin, end, words);

    vector<WordRange> hmmRes;
    hmmRes.reserve(end - begin);
    for (size_t i = 0; i < words.size(); i++) {
      //if mp Get a word, it's ok, put it into result
      if (words[i].left != words[i].right || (words[i].left == words[i].right && mpSeg_.IsUserDictSingleChineseWord(words[i].left->rune))) {
        res.push_back(words[i]);
        continue;
      }

      // if mp Get a single one and it is not in userdict, collect it in sequence
      size_t j = i;
      while (j < words.size() && words[j].left == words[j].right && !mpSeg_.IsUserDictSingleChineseWord(words[j].left->rune)) {
        j++;
      }

      // Cut the sequence with hmm
      assert(j - 1 >= i);
      // TODO
      hmmSeg_.Cut(words[i].left, words[j - 1].left + 1, hmmRes);
      //put hmm result to result
      for (size_t k = 0; k < hmmRes.size(); k++) {
        res.push_back(hmmRes[k]);
      }

      //clear tmp vars
      hmmRes.clear();

      //let i jump over this piece
      i = j - 1;
    }
  }